

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.h
# Opt level: O2

double brotli::BitsEntropy(uint32_t *population,size_t size)

{
  uint *puVar1;
  size_t v;
  ulong uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  puVar1 = population + size;
  dVar6 = 0.0;
  v = 0;
  if ((size & 1) != 0) goto LAB_0017e88f;
  for (; population < puVar1; population = population + 1) {
    uVar2 = (ulong)*population;
    population = population + 1;
    v = v + uVar2;
    dVar3 = FastLog2(uVar2);
    dVar6 = dVar6 - dVar3 * (double)uVar2;
LAB_0017e88f:
    uVar2 = (ulong)*population;
    v = v + uVar2;
    dVar3 = FastLog2(uVar2);
    dVar6 = dVar6 - dVar3 * (double)uVar2;
  }
  auVar5._8_4_ = (int)(v >> 0x20);
  auVar5._0_8_ = v;
  auVar5._12_4_ = 0x45300000;
  dVar3 = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0);
  if (v != 0) {
    dVar4 = FastLog2(v);
    dVar6 = dVar6 + dVar4 * dVar3;
  }
  if (dVar3 <= dVar6) {
    dVar3 = dVar6;
  }
  return dVar3;
}

Assistant:

static inline double BitsEntropy(const uint32_t *population, size_t size) {
  size_t sum;
  double retval = ShannonEntropy(population, size, &sum);
  if (retval < sum) {
    // At least one bit per literal is needed.
    retval = static_cast<double>(sum);
  }
  return retval;
}